

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

bool __thiscall
Js::JavascriptString::GetPropertyBuiltIns
          (JavascriptString *this,PropertyId propertyId,Var *value,ScriptContext *requestContext)

{
  charcount_t nValue;
  Var pvVar1;
  RecyclableObject *pRVar2;
  ScriptContext *requestContext_local;
  Var *value_local;
  PropertyId propertyId_local;
  JavascriptString *this_local;
  
  if (propertyId != 0xd1) {
    pRVar2 = ScriptContext::GetMissingPropertyResult(requestContext);
    *value = pRVar2;
  }
  else {
    nValue = GetLength(this);
    pvVar1 = JavascriptNumber::ToVar(nValue,requestContext);
    *value = pvVar1;
  }
  this_local._7_1_ = propertyId == 0xd1;
  return this_local._7_1_;
}

Assistant:

bool JavascriptString::GetPropertyBuiltIns(PropertyId propertyId, Var* value, ScriptContext* requestContext)
    {
        if (propertyId == PropertyIds::length)
        {
            *value = JavascriptNumber::ToVar(this->GetLength(), requestContext);
            return true;
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }